

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void getServicePointers(UA_UInt32 requestTypeId,UA_DataType **requestType,UA_DataType **responseType
                       ,UA_Service *service,UA_Boolean *requiresSession)

{
  UA_Boolean *requiresSession_local;
  UA_Service *service_local;
  UA_DataType **responseType_local;
  UA_DataType **requestType_local;
  UA_UInt32 requestTypeId_local;
  
  if (requestTypeId == 0x1a6) {
    *service = Service_FindServers;
    *requestType = UA_TYPES + 0x75;
    *responseType = UA_TYPES + 0x91;
    *requiresSession = false;
  }
  else if (requestTypeId == 0x1ac) {
    *service = Service_GetEndpoints;
    *requestType = UA_TYPES + 0x6e;
    *responseType = UA_TYPES + 0x9c;
    *requiresSession = false;
  }
  else if (requestTypeId == 0x1cd) {
    *service = Service_CreateSession;
    *requestType = UA_TYPES + 0x99;
    *responseType = UA_TYPES + 0xa1;
    *requiresSession = false;
  }
  else if (requestTypeId == 0x1d3) {
    *service = Service_ActivateSession;
    *requestType = UA_TYPES + 0x53;
    *responseType = UA_TYPES + 0x58;
  }
  else if (requestTypeId == 0x1d9) {
    *service = Service_CloseSession;
    *requestType = UA_TYPES + 99;
    *responseType = UA_TYPES + 0x8e;
  }
  else if (requestTypeId == 0x1e8) {
    *service = Service_AddNodes;
    *requestType = UA_TYPES + 0x95;
    *responseType = UA_TYPES + 0x70;
  }
  else if (requestTypeId == 0x1ee) {
    *service = Service_AddReferences;
    *requestType = UA_TYPES + 0x86;
    *responseType = UA_TYPES + 0x8a;
  }
  else if (requestTypeId == 500) {
    *service = Service_DeleteNodes;
    *requestType = UA_TYPES + 0x4d;
    *responseType = UA_TYPES + 0x80;
  }
  else if (requestTypeId == 0x1fa) {
    *service = Service_DeleteReferences;
    *requestType = UA_TYPES + 0x83;
    *responseType = UA_TYPES + 0x7d;
  }
  else if (requestTypeId == 0x20f) {
    *service = Service_Browse;
    *requestType = UA_TYPES + 0x96;
    *responseType = UA_TYPES + 0xa0;
  }
  else if (requestTypeId == 0x215) {
    *service = Service_BrowseNext;
    *requestType = UA_TYPES + 0x5c;
    *responseType = UA_TYPES + 0x9e;
  }
  else if (requestTypeId == 0x22a) {
    *service = Service_TranslateBrowsePathsToNodeIds;
    *requestType = UA_TYPES + 0x9f;
    *responseType = UA_TYPES + 0x8b;
  }
  else if (requestTypeId == 0x230) {
    *service = Service_RegisterNodes;
    *requestType = UA_TYPES + 0x4c;
    *responseType = UA_TYPES + 0x62;
  }
  else if (requestTypeId == 0x236) {
    *service = Service_UnregisterNodes;
    *requestType = UA_TYPES + 0x2a;
    *responseType = UA_TYPES + 0x69;
  }
  else if (requestTypeId == 0x277) {
    *service = Service_Read;
    *requestType = UA_TYPES + 0x87;
    *responseType = UA_TYPES + 0x85;
  }
  else if (requestTypeId == 0x2a1) {
    *service = Service_Write;
    *requestType = UA_TYPES + 0x6a;
    *responseType = UA_TYPES + 0x5b;
  }
  else if (requestTypeId == 0x2c8) {
    *service = Service_Call;
    *requestType = UA_TYPES + 0x30;
    *responseType = UA_TYPES + 0x7f;
  }
  else if (requestTypeId == 0x2ef) {
    *service = Service_CreateMonitoredItems;
    *requestType = UA_TYPES + 0x92;
    *responseType = UA_TYPES + 0x7e;
  }
  else if (requestTypeId == 0x2fb) {
    *service = Service_ModifyMonitoredItems;
    *requestType = UA_TYPES + 0x73;
    *responseType = UA_TYPES + 0x84;
  }
  else if (requestTypeId == 0x301) {
    *service = Service_SetMonitoringMode;
    *requestType = UA_TYPES + 0x68;
    *responseType = UA_TYPES + 0x74;
  }
  else if (requestTypeId == 0x30d) {
    *service = Service_DeleteMonitoredItems;
    *requestType = UA_TYPES + 0x66;
    *responseType = UA_TYPES + 0x4a;
  }
  else if (requestTypeId == 0x313) {
    *service = Service_CreateSubscription;
    *requestType = UA_TYPES + 0x5d;
    *responseType = UA_TYPES + 0x7a;
  }
  else if (requestTypeId == 0x319) {
    *service = Service_ModifySubscription;
    *requestType = UA_TYPES + 100;
    *responseType = UA_TYPES + 0x60;
  }
  else if (requestTypeId == 799) {
    *service = Service_SetPublishingMode;
    *requestType = UA_TYPES + 0x2e;
    *responseType = UA_TYPES + 0x77;
  }
  else if (requestTypeId == 0x33a) {
    *requestType = UA_TYPES + 0x6f;
    *responseType = UA_TYPES + 0x4e;
  }
  else if (requestTypeId == 0x340) {
    *service = Service_Republish;
    *requestType = UA_TYPES + 0x6d;
    *responseType = UA_TYPES + 0x81;
  }
  else if (requestTypeId == 0x34f) {
    *service = Service_DeleteSubscriptions;
    *requestType = UA_TYPES + 0x48;
    *responseType = UA_TYPES + 0x7b;
  }
  return;
}

Assistant:

static void
getServicePointers(UA_UInt32 requestTypeId, const UA_DataType **requestType,
                   const UA_DataType **responseType, UA_Service *service,
                   UA_Boolean *requiresSession) {
    switch(requestTypeId) {
    case UA_NS0ID_GETENDPOINTSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_GetEndpoints;
        *requestType = &UA_TYPES[UA_TYPES_GETENDPOINTSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_GETENDPOINTSRESPONSE];
        *requiresSession = false;
        break;
    case UA_NS0ID_FINDSERVERSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_FindServers;
        *requestType = &UA_TYPES[UA_TYPES_FINDSERVERSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_FINDSERVERSRESPONSE];
        *requiresSession = false;
        break;
    case UA_NS0ID_CREATESESSIONREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_CreateSession;
        *requestType = &UA_TYPES[UA_TYPES_CREATESESSIONREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_CREATESESSIONRESPONSE];
        *requiresSession = false;
        break;
    case UA_NS0ID_ACTIVATESESSIONREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_ActivateSession;
        *requestType = &UA_TYPES[UA_TYPES_ACTIVATESESSIONREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_ACTIVATESESSIONRESPONSE];
        break;
    case UA_NS0ID_CLOSESESSIONREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_CloseSession;
        *requestType = &UA_TYPES[UA_TYPES_CLOSESESSIONREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_CLOSESESSIONRESPONSE];
        break;
    case UA_NS0ID_READREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_Read;
        *requestType = &UA_TYPES[UA_TYPES_READREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_READRESPONSE];
        break;
    case UA_NS0ID_WRITEREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_Write;
        *requestType = &UA_TYPES[UA_TYPES_WRITEREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_WRITERESPONSE];
        break;
    case UA_NS0ID_BROWSEREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_Browse;
        *requestType = &UA_TYPES[UA_TYPES_BROWSEREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_BROWSERESPONSE];
        break;
    case UA_NS0ID_BROWSENEXTREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_BrowseNext;
        *requestType = &UA_TYPES[UA_TYPES_BROWSENEXTREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_BROWSENEXTRESPONSE];
        break;
    case UA_NS0ID_REGISTERNODESREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_RegisterNodes;
        *requestType = &UA_TYPES[UA_TYPES_REGISTERNODESREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_REGISTERNODESRESPONSE];
        break;
    case UA_NS0ID_UNREGISTERNODESREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_UnregisterNodes;
        *requestType = &UA_TYPES[UA_TYPES_UNREGISTERNODESREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_UNREGISTERNODESRESPONSE];
        break;
    case UA_NS0ID_TRANSLATEBROWSEPATHSTONODEIDSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_TranslateBrowsePathsToNodeIds;
        *requestType = &UA_TYPES[UA_TYPES_TRANSLATEBROWSEPATHSTONODEIDSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_TRANSLATEBROWSEPATHSTONODEIDSRESPONSE];
        break;

#ifdef UA_ENABLE_SUBSCRIPTIONS
    case UA_NS0ID_CREATESUBSCRIPTIONREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_CreateSubscription;
        *requestType = &UA_TYPES[UA_TYPES_CREATESUBSCRIPTIONREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_CREATESUBSCRIPTIONRESPONSE];
        break;
    case UA_NS0ID_PUBLISHREQUEST_ENCODING_DEFAULTBINARY:
        *requestType = &UA_TYPES[UA_TYPES_PUBLISHREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_PUBLISHRESPONSE];
        break;
    case UA_NS0ID_REPUBLISHREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_Republish;
        *requestType = &UA_TYPES[UA_TYPES_REPUBLISHREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_REPUBLISHRESPONSE];
        break;
    case UA_NS0ID_MODIFYSUBSCRIPTIONREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_ModifySubscription;
        *requestType = &UA_TYPES[UA_TYPES_MODIFYSUBSCRIPTIONREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_MODIFYSUBSCRIPTIONRESPONSE];
        break;
    case UA_NS0ID_SETPUBLISHINGMODEREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_SetPublishingMode;
        *requestType = &UA_TYPES[UA_TYPES_SETPUBLISHINGMODEREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_SETPUBLISHINGMODERESPONSE];
        break;
    case UA_NS0ID_DELETESUBSCRIPTIONSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_DeleteSubscriptions;
        *requestType = &UA_TYPES[UA_TYPES_DELETESUBSCRIPTIONSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_DELETESUBSCRIPTIONSRESPONSE];
        break;
    case UA_NS0ID_CREATEMONITOREDITEMSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_CreateMonitoredItems;
        *requestType = &UA_TYPES[UA_TYPES_CREATEMONITOREDITEMSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_CREATEMONITOREDITEMSRESPONSE];
        break;
    case UA_NS0ID_DELETEMONITOREDITEMSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_DeleteMonitoredItems;
        *requestType = &UA_TYPES[UA_TYPES_DELETEMONITOREDITEMSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_DELETEMONITOREDITEMSRESPONSE];
        break;
    case UA_NS0ID_MODIFYMONITOREDITEMSREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_ModifyMonitoredItems;
        *requestType = &UA_TYPES[UA_TYPES_MODIFYMONITOREDITEMSREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_MODIFYMONITOREDITEMSRESPONSE];
        break;
    case UA_NS0ID_SETMONITORINGMODEREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_SetMonitoringMode;
        *requestType = &UA_TYPES[UA_TYPES_SETMONITORINGMODEREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_SETMONITORINGMODERESPONSE];
        break;
#endif

#ifdef UA_ENABLE_METHODCALLS
    case UA_NS0ID_CALLREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_Call;
        *requestType = &UA_TYPES[UA_TYPES_CALLREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_CALLRESPONSE];
        break;
#endif

#ifdef UA_ENABLE_NODEMANAGEMENT
    case UA_NS0ID_ADDNODESREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_AddNodes;
        *requestType = &UA_TYPES[UA_TYPES_ADDNODESREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_ADDNODESRESPONSE];
        break;
    case UA_NS0ID_ADDREFERENCESREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_AddReferences;
        *requestType = &UA_TYPES[UA_TYPES_ADDREFERENCESREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_ADDREFERENCESRESPONSE];
        break;
    case UA_NS0ID_DELETENODESREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_DeleteNodes;
        *requestType = &UA_TYPES[UA_TYPES_DELETENODESREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_DELETENODESRESPONSE];
        break;
    case UA_NS0ID_DELETEREFERENCESREQUEST_ENCODING_DEFAULTBINARY:
        *service = (UA_Service)Service_DeleteReferences;
        *requestType = &UA_TYPES[UA_TYPES_DELETEREFERENCESREQUEST];
        *responseType = &UA_TYPES[UA_TYPES_DELETEREFERENCESRESPONSE];
        break;
#endif

    default:
        break;
    }
}